

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O3

rt_expression_interface<double> * __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::substitute
          (rt_binary_expr<viennamath::rt_expression_interface<double>_> *this,
          vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
          *e,vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
             *repl)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  rt_expression_interface<double> *prVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  rt_expression_interface<double> *prVar6;
  ulong uVar7;
  
  lVar4 = *(long *)e;
  if (*(long *)(e + 8) != lVar4) {
    uVar7 = 0;
    do {
      iVar1 = (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[0xb])
                        (this,*(undefined8 *)(lVar4 + uVar7 * 8));
      if ((char)iVar1 != '\0') {
        prVar6 = (rt_expression_interface<double> *)
                 (**(code **)(**(long **)(*(long *)repl + uVar7 * 8) + 0x10))();
        return prVar6;
      }
      uVar7 = uVar7 + 1;
      lVar4 = *(long *)e;
    } while (uVar7 < (ulong)(*(long *)(e + 8) - lVar4 >> 3));
  }
  prVar5 = (rt_expression_interface<double> *)operator_new(0x20);
  prVar6 = (this->lhs_)._M_ptr;
  iVar1 = (*prVar6->_vptr_rt_expression_interface[0xf])(prVar6,e,repl);
  iVar2 = (*((this->op_)._M_ptr)->_vptr_op_interface[2])();
  prVar6 = (this->rhs_)._M_ptr;
  iVar3 = (*prVar6->_vptr_rt_expression_interface[0xf])(prVar6,e,repl);
  prVar5->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_binary_expr_0011e158;
  prVar5[1]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var,iVar1);
  prVar5[2]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var_00,iVar2);
  prVar5[3]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var_01,iVar3);
  return prVar5;
}

Assistant:

InterfaceType * substitute(std::vector<const InterfaceType *> const &  e,
                                 std::vector<const InterfaceType *> const &  repl) const
      {
        for (size_t i=0; i<e.size(); ++i)
          if (deep_equal(e[i]))
            return repl[i]->clone();

        return new rt_binary_expr(lhs_->substitute(e, repl),
                               op_->clone(),
                               rhs_->substitute(e, repl) );
      }